

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
punky::ast::IfExpression::to_string_abi_cxx11_(string *__return_storage_ptr__,IfExpression *this)

{
  bool bVar1;
  pointer pEVar2;
  pointer pBVar3;
  unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *this_00;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  IfExpression *local_18;
  IfExpression *this_local;
  string *if_str;
  
  local_18 = this;
  this_local = (IfExpression *)__return_storage_ptr__;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_condition);
  if ((bVar1) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_consequence), bVar1)) {
    local_19 = 0;
    ExprNode::token_literal_abi_cxx11_(&local_a0,&this->super_ExprNode);
    std::operator+(&local_80,&local_a0," ");
    pEVar2 = std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>::
             operator->(&this->m_condition);
    (*(pEVar2->super_AstNode)._vptr_AstNode[3])(&local_d0);
    std::operator+(&local_60,&local_80,&local_d0);
    std::operator+(&local_40,&local_60," ");
    pBVar3 = std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>::
             operator->(&this->m_consequence);
    (*(pBVar3->super_StmtNode).super_AstNode._vptr_AstNode[3])(&local_f0);
    std::operator+(__return_storage_ptr__,&local_40,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    bVar1 = std::
            optional<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
            ::has_value(&this->m_alternative);
    if (bVar1) {
      this_00 = std::
                optional<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                ::value(&this->m_alternative);
      pBVar3 = std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>::
               operator->(this_00);
      (*(pBVar3->super_StmtNode).super_AstNode._vptr_AstNode[3])(&local_130);
      std::operator+(&local_110,"else ",&local_130);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_131);
    std::allocator<char>::~allocator(&local_131);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IfExpression::to_string() const
{
    if (m_condition && m_consequence)
    {
        std::string if_str{token_literal() + " " + m_condition->to_string()
                           + " " + m_consequence->to_string()};
        if (m_alternative.has_value())
            if_str.append("else " + m_alternative.value()->to_string());
        return if_str;
    }
    return "";
}